

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gost_gost2015.c
# Opt level: O2

int gost_mgm128_aad(mgm128_context *ctx,uchar *aad,size_t len)

{
  block128_f p_Var1;
  mul128_f p_Var2;
  void *pvVar3;
  uint64_t uVar4;
  int iVar5;
  uint uVar6;
  ulong uVar7;
  uint uVar8;
  ulong uVar9;
  size_t local_40;
  
  if ((ctx->len).u[1] == 0) {
    uVar7 = (ctx->len).u[0];
    p_Var1 = ctx->block;
    p_Var2 = ctx->mul_gf;
    pvVar3 = ctx->key;
    uVar6 = ctx->blocklen;
    uVar9 = (ulong)(int)uVar6;
    if (uVar7 == 0) {
      (ctx->nonce).c[0] = (ctx->nonce).c[0] | 0x80;
      (*p_Var1)((uchar *)ctx,(uchar *)&ctx->Zi,pvVar3);
    }
    if ((CARRY8(uVar7,len)) || ((ulong)(1L << ((char)uVar6 * '\x04' - 3U & 0x3f)) < uVar7 + len)) {
      ERR_GOST_error(0xaa,0x8d,
                     "/workspace/llm4binary/github/license_c_cmakelists/gost-engine[P]engine/gost_gost2015.c"
                     ,0x108);
      iVar5 = -1;
    }
    else {
      (ctx->len).u[0] = uVar7 + len;
      uVar8 = ctx->ares;
      if (uVar8 == 0) {
        local_40 = (size_t)((int)uVar6 / 2);
      }
      else {
        while( true ) {
          if ((uVar8 == 0) || (len == 0)) break;
          uVar4 = *(uint64_t *)aad;
          aad = (uchar *)((long)aad + 1);
          (ctx->ACi).c[uVar8] = (uchar)uVar4;
          uVar8 = (uVar8 + 1) % uVar6;
          len = len - 1;
        }
        if (uVar8 != 0) {
          ctx->ares = uVar8;
          return 0;
        }
        (*p_Var1)((uchar *)&ctx->Zi,(uchar *)&ctx->Hi,pvVar3);
        (*p_Var2)((ctx->mul).u,(uint64_t *)&ctx->Hi,(uint64_t *)&ctx->ACi);
        grasshopper_plus128((grasshopper_w128_t *)&ctx->sum,(grasshopper_w128_t *)&ctx->sum,
                            (grasshopper_w128_t *)&ctx->mul);
        local_40 = (size_t)((int)uVar6 / 2);
        inc_counter((uchar *)(ctx->Zi).u,local_40);
      }
      while (uVar9 <= len) {
        (*p_Var1)((uchar *)&ctx->Zi,(uchar *)&ctx->Hi,pvVar3);
        (*p_Var2)((ctx->mul).u,(uint64_t *)&ctx->Hi,(uint64_t *)aad);
        grasshopper_plus128((grasshopper_w128_t *)&ctx->sum,(grasshopper_w128_t *)&ctx->sum,
                            (grasshopper_w128_t *)&ctx->mul);
        inc_counter((uchar *)(ctx->Zi).u,local_40);
        aad = (uchar *)((long)aad + uVar9);
        len = len - uVar9;
      }
      iVar5 = 0;
      uVar6 = 0;
      if (len != 0) {
        for (uVar7 = 0; len != uVar7; uVar7 = uVar7 + 1) {
          (ctx->ACi).c[uVar7] = *(uint8_t *)((long)aad + uVar7);
        }
        uVar6 = (uint)len;
      }
      ctx->ares = uVar6;
    }
  }
  else {
    ERR_GOST_error(0xaa,0x84,
                   "/workspace/llm4binary/github/license_c_cmakelists/gost-engine[P]engine/gost_gost2015.c"
                   ,0xfb);
    iVar5 = -2;
  }
  return iVar5;
}

Assistant:

int gost_mgm128_aad(mgm128_context *ctx, const unsigned char *aad,
                      size_t len)
{
    size_t i;
    unsigned int n;
    uint64_t alen = ctx->len.u[0];
    block128_f block = ctx->block;
    mul128_f mul_gf = ctx->mul_gf;
    void *key = ctx->key;
    int bl = ctx->blocklen;

    if (ctx->len.u[1]) {
        GOSTerr(GOST_F_GOST_MGM128_AAD,
                GOST_R_BAD_ORDER);
        return -2;
    }

    if (alen == 0) {
        ctx->nonce.c[0] |= 0x80;
        (*block) (ctx->nonce.c, ctx->Zi.c, key);    // Z_1 = E_K(1 || nonce)
    }

    alen += len;
    if (alen > ((ossl_uintmax_t)(1) << (bl * 4 - 3)) ||      // < 2^(n/2)  (len stores in bytes)
        (sizeof(len) == 8 && alen < len)) {
            GOSTerr(GOST_F_GOST_MGM128_AAD,
                    GOST_R_DATA_TOO_LARGE);
            return -1;
        }
    ctx->len.u[0] = alen;

    n = ctx->ares;
    if (n) {
        /* Finalize partial_data */
        while (n && len) {
            ctx->ACi.c[n] = *(aad++);
            --len;
            n = (n + 1) % bl;
        }
        if (n == 0) {
            (*block) (ctx->Zi.c, ctx->Hi.c, key);                   // H_i = E_K(Z_i)
            mul_gf(ctx->mul.u, ctx->Hi.u, ctx->ACi.u);              // H_i (x) A_i
            grasshopper_plus128((grasshopper_w128_t*)ctx->sum.u,    // acc XOR
              (grasshopper_w128_t*)ctx->sum.u, (grasshopper_w128_t*)ctx->mul.u);
            inc_counter(ctx->Zi.c, bl / 2);                              // Z_{i+1} = incr_l(Z_i)
        } else {
            ctx->ares = n;
            return 0;
        }
    }
    while (len >= bl) {
        (*block) (ctx->Zi.c, ctx->Hi.c, key);                       // H_i = E_K(Z_i)
        mul_gf(ctx->mul.u, ctx->Hi.u, (uint64_t *)aad);             // H_i (x) A_i
        grasshopper_plus128((grasshopper_w128_t*)ctx->sum.u,        // acc XOR
            (grasshopper_w128_t*)ctx->sum.u, (grasshopper_w128_t*)ctx->mul.u);
        inc_counter(ctx->Zi.c, bl / 2);                                  // Z_{i+1} = incr_l(Z_i)
        aad += bl;
        len -= bl;
    }
    if (len) {
        n = (unsigned int)len;
        for (i = 0; i < len; ++i)
            ctx->ACi.c[i] = aad[i];
    }

    ctx->ares = n;
    return 0;
}